

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_buildCTable
                 (void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                 symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                 S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                 size_t prevCTableSize,void *entropyWorkspace,size_t entropyWorkspaceSize)

{
  uint tableLog;
  size_t sVar1;
  ulong uVar2;
  size_t err_code;
  ulong uStack_40;
  
  switch(type) {
  case set_basic:
    uVar2 = FSE_buildCTable_wksp
                      (nextCTable,defaultNorm,defaultMax,defaultNormLog,entropyWorkspace,
                       entropyWorkspaceSize);
    uStack_40 = 0;
    goto LAB_003d0229;
  case set_rle:
    uStack_40 = FSE_buildCTable_rle(nextCTable,(BYTE)max);
    if (uStack_40 < 0xffffffffffffff89) {
      if (dstCapacity == 0) {
        uStack_40 = 0xffffffffffffffba;
      }
      else {
        *(BYTE *)dst = *codeTable;
        uStack_40 = 1;
      }
    }
    break;
  case set_compressed:
    tableLog = FSE_optimalTableLog(FSELog,nbSeq,max);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      nbSeq = nbSeq - 1;
    }
    sVar1 = FSE_normalizeCount((short *)entropyWorkspace,tableLog,count,nbSeq,max,
                               (uint)(0x7ff < nbSeq));
    if (0xffffffffffffff88 < sVar1) {
      return sVar1;
    }
    uStack_40 = FSE_writeNCount(dst,dstCapacity,(short *)entropyWorkspace,max,tableLog);
    if (0xffffffffffffff88 < uStack_40) {
      return uStack_40;
    }
    uVar2 = FSE_buildCTable_wksp
                      (nextCTable,(short *)entropyWorkspace,max,tableLog,
                       (void *)((long)entropyWorkspace + 0x6c),0x474);
LAB_003d0229:
    if (0xffffffffffffff88 < uVar2) {
      uStack_40 = uVar2;
    }
    break;
  case set_repeat:
    switchD_0036ec8a::default(nextCTable,prevCTable,prevCTableSize);
    uStack_40 = 0;
    break;
  default:
    uStack_40 = 0xffffffffffffffff;
  }
  return uStack_40;
}

Assistant:

size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* entropyWorkspace, size_t entropyWorkspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max), "");
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall, "not enough space");
        *op = codeTable[0];
        return 1;
    case set_repeat:
        ZSTD_memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, entropyWorkspace, entropyWorkspaceSize), "");  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        ZSTD_BuildCTableWksp* wksp = (ZSTD_BuildCTableWksp*)entropyWorkspace;
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        assert(entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp));
        (void)entropyWorkspaceSize;
        FORWARD_IF_ERROR(FSE_normalizeCount(wksp->norm, tableLog, count, nbSeq_1, max, ZSTD_useLowProbCount(nbSeq_1)), "FSE_normalizeCount failed");
        assert(oend >= op);
        {   size_t const NCountSize = FSE_writeNCount(op, (size_t)(oend - op), wksp->norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize, "FSE_writeNCount failed");
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, wksp->norm, max, tableLog, wksp->wksp, sizeof(wksp->wksp)), "FSE_buildCTable_wksp failed");
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC, "impossible to reach");
    }
}